

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

JavascriptArray *
Js::JavascriptObject::CreateKeysHelper
          (RecyclableObject *object,ScriptContext *scriptContext,BOOL includeNonEnumerable,
          bool includeSymbolProperties,bool includeStringProperties,bool includeSpecialProperties)

{
  uint uVar1;
  code *pcVar2;
  uint32 itemIndex;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  undefined4 *puVar7;
  EnumeratorCache *pEVar8;
  JavascriptString *value;
  PropertyRecord *propertyRecord;
  Var newValue;
  JavascriptSymbol *newValue_00;
  JavascriptArray *this;
  undefined4 extraout_var;
  uint32 index;
  uint uVar9;
  ulong uVar10;
  undefined7 in_register_00000089;
  uint32 uVar11;
  undefined1 local_b8 [8];
  JavascriptStaticEnumerator enumerator;
  PropertyId local_4c;
  undefined4 local_48;
  PropertyId propertyId;
  JavascriptArray *local_40;
  ulong local_38;
  
  local_48 = (undefined4)CONCAT71(in_register_00000089,includeSpecialProperties);
  if (!includeSymbolProperties && !includeStringProperties) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x4cc,"(includeStringProperties || includeSymbolProperties)",
                                "Should either get string or symbol properties.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  JavascriptStaticEnumerator::JavascriptStaticEnumerator((JavascriptStaticEnumerator *)local_b8);
  local_40 = JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,0);
  bVar4 = includeNonEnumerable == 0 ^ 0xd;
  bVar5 = bVar4 | 2;
  if (!includeSymbolProperties) {
    bVar5 = bVar4;
  }
  pEVar8 = JavascriptLibrary::GetCreateKeysCache
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,(object->type).ptr)
  ;
  iVar6 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])(object,local_b8,(ulong)bVar5,scriptContext,pEVar8);
  if (iVar6 != 0) {
    local_38 = 0;
    this = (JavascriptArray *)0x0;
    uVar11 = 0;
    while( true ) {
      value = JavascriptStaticEnumerator::MoveAndGetNext
                        ((JavascriptStaticEnumerator *)local_b8,&local_4c,(PropertyAttributes *)0x0)
      ;
      if (value == (JavascriptString *)0x0) break;
      enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)value;
      if (includeSymbolProperties) {
        propertyRecord = ScriptContext::GetPropertyName(scriptContext,local_4c);
        if (propertyRecord->isSymbol != true) goto LAB_00b9209d;
        newValue_00 = ScriptContext::GetSymbol(scriptContext,propertyRecord);
        if (this == (JavascriptArray *)0x0) {
          this = JavascriptLibrary::CreateArray
                           ((scriptContext->super_ScriptContextBase).javascriptLibrary,0);
        }
        JavascriptArray::DirectSetItemAt<Js::JavascriptSymbol*>(this,uVar11,newValue_00);
        uVar11 = uVar11 + 1;
      }
      else {
LAB_00b9209d:
        if (includeStringProperties) {
          itemIndex = (uint32)local_38;
          propertyId = itemIndex + 1;
          newValue = CrossSite::MarshalVar
                               (scriptContext,value,
                                (((((value->super_RecyclableObject).type.ptr)->javascriptLibrary).
                                 ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
          JavascriptArray::DirectSetItemAt<void*>(local_40,itemIndex,newValue);
          local_38 = (ulong)(uint)propertyId;
        }
      }
    }
    enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)0x0;
    if ((includeStringProperties & (byte)local_48) == 1) {
      uVar10 = 0;
      while( true ) {
        uVar11 = (int)local_38 + (int)uVar10;
        iVar6 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x3f])
                          (object,uVar10,&enumerator.arrayEnumerator,scriptContext);
        if (iVar6 == 0) break;
        JavascriptArray::DirectSetItemAt<Js::JavascriptString*>
                  (local_40,uVar11,(JavascriptString *)enumerator.arrayEnumerator.ptr);
        uVar10 = (ulong)((int)uVar10 + 1);
      }
    }
    else {
      uVar11 = (uint32)local_38;
    }
    if (this != (JavascriptArray *)0x0) {
      uVar1 = (this->super_ArrayObject).length;
      for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
        iVar6 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(this,(ulong)uVar9);
        JavascriptArray::DirectSetItemAt<void*>
                  (local_40,uVar11 + uVar9,(Var)CONCAT44(extraout_var,iVar6));
      }
    }
  }
  return local_40;
}

Assistant:

JavascriptArray* JavascriptObject::CreateKeysHelper(RecyclableObject* object, ScriptContext* scriptContext, BOOL includeNonEnumerable, bool includeSymbolProperties, bool includeStringProperties, bool includeSpecialProperties)
{
    //1. Let keys be a new empty List.
    //2. For each own property key P of O that is an integer index, in ascending numeric index order
    //      a. Add P as the last element of keys.
    //3. For each own property key P of O that is a String but is not an integer index, in property creation order
    //      a. Add P as the last element of keys.
    //4. For each own property key P of O that is a Symbol, in property creation order
    //      a. Add P as the last element of keys.
    //5. Return keys.
    AssertMsg(includeStringProperties || includeSymbolProperties, "Should either get string or symbol properties.");

    JavascriptStaticEnumerator enumerator;
    EnumeratorFlags flags = EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::UseCache;
    JavascriptArray* newArr = scriptContext->GetLibrary()->CreateArray(0);
    if (includeNonEnumerable)
    {
        flags |= EnumeratorFlags::EnumNonEnumerable;
    }
    if (includeSymbolProperties)
    {
        flags |= EnumeratorFlags::EnumSymbols;
    }
    EnumeratorCache* cache = scriptContext->GetLibrary()->GetCreateKeysCache(object->GetType());
    if (!object->GetEnumerator(&enumerator, flags, scriptContext, cache))
    {
        return newArr;  // Return an empty array if we don't have an enumerator
    }

    JavascriptString * propertyName = nullptr;
    PropertyId propertyId;
    uint32 propertyIndex = 0;
    uint32 symbolIndex = 0;
    const PropertyRecord* propertyRecord;
    JavascriptSymbol* symbol;
    JavascriptArray* newArrForSymbols = nullptr;
    while ((propertyName = enumerator.MoveAndGetNext(propertyId)) != NULL)
    {
        if (propertyName)
        {
            if (includeSymbolProperties)
            {
                propertyRecord = scriptContext->GetPropertyName(propertyId);

                if (propertyRecord->IsSymbol())
                {
                    symbol = scriptContext->GetSymbol(propertyRecord);
                    // no need to marshal symbol because it is created from scriptContext
                    if (!newArrForSymbols)
                    {
                        newArrForSymbols = scriptContext->GetLibrary()->CreateArray(0);
                    }
                    newArrForSymbols->DirectSetItemAt(symbolIndex++, symbol);
                    continue;
                }
            }
            if (includeStringProperties)
            {
                newArr->DirectSetItemAt(propertyIndex++, CrossSite::MarshalVar(scriptContext, propertyName, propertyName->GetScriptContext()));
            }
        }
    }

    // Special properties
    if (includeSpecialProperties && includeStringProperties)
    {
        uint32 index = 0;
        while (object->GetSpecialPropertyName(index, &propertyName, scriptContext))
        {
            newArr->DirectSetItemAt(propertyIndex++, propertyName);
            index++;
        }
    }

    if (newArrForSymbols)
    {
        // Append all the symbols at the end of list
        uint32 totalSymbols = newArrForSymbols->GetLength();
        for (uint32 symIndex = 0; symIndex < totalSymbols; symIndex++)
        {
            newArr->DirectSetItemAt(propertyIndex++, newArrForSymbols->DirectGetItem(symIndex));
        }
    }

    return newArr;
}